

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsources.cpp
# Opt level: O1

int __thiscall
jrtplib::RTPSources::GetRTCPSourceData
          (RTPSources *this,uint32_t ssrc,RTPAddress *senderaddress,RTPInternalSourceData **srcdat2,
          bool *newsource)

{
  RTPAddress *pRVar1;
  RTPMemoryManager *pRVar2;
  RTPInternalSourceData *pRVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  bool created;
  RTPInternalSourceData *srcdat;
  bool local_41;
  RTPInternalSourceData *local_40;
  bool *local_38;
  
  *srcdat2 = (RTPInternalSourceData *)0x0;
  iVar5 = ObtainSourceDataInstance(this,ssrc,&local_40,&local_41);
  pRVar3 = local_40;
  if (iVar5 < 0) {
    return iVar5;
  }
  local_38 = newsource;
  if (local_41 != true) {
    bVar4 = CheckCollision(this,local_40,senderaddress,false);
    if (bVar4) {
      return 0;
    }
    goto LAB_0011fbaf;
  }
  if (senderaddress == (RTPAddress *)0x0) {
    pRVar1 = (local_40->super_RTPSourceData).rtcpaddr;
    if (pRVar1 != (RTPAddress *)0x0) {
      pRVar2 = (local_40->super_RTPSourceData).super_RTPMemoryObject.mgr;
      if (pRVar2 == (RTPMemoryManager *)0x0) {
        (*pRVar1->_vptr_RTPAddress[4])(pRVar1);
      }
      else {
        (*pRVar1->_vptr_RTPAddress[3])(pRVar1);
        (*pRVar2->_vptr_RTPMemoryManager[3])(pRVar2,pRVar1);
      }
      (pRVar3->super_RTPSourceData).rtcpaddr = (RTPAddress *)0x0;
    }
LAB_0011fc28:
    (pRVar3->super_RTPSourceData).isrtcpaddrset = true;
    bVar4 = false;
    iVar5 = 0;
  }
  else {
    iVar5 = (**senderaddress->_vptr_RTPAddress)
                      (senderaddress,(local_40->super_RTPSourceData).super_RTPMemoryObject.mgr);
    if ((RTPAddress *)CONCAT44(extraout_var,iVar5) != (RTPAddress *)0x0) {
      pRVar1 = (pRVar3->super_RTPSourceData).rtcpaddr;
      if (pRVar1 != senderaddress && pRVar1 != (RTPAddress *)0x0) {
        pRVar2 = (pRVar3->super_RTPSourceData).super_RTPMemoryObject.mgr;
        if (pRVar2 == (RTPMemoryManager *)0x0) {
          (*pRVar1->_vptr_RTPAddress[4])(pRVar1);
        }
        else {
          (*pRVar1->_vptr_RTPAddress[3])(pRVar1);
          (*pRVar2->_vptr_RTPMemoryManager[3])(pRVar2,pRVar1);
        }
      }
      (pRVar3->super_RTPSourceData).rtcpaddr = (RTPAddress *)CONCAT44(extraout_var,iVar5);
      goto LAB_0011fc28;
    }
    iVar5 = -1;
    bVar4 = true;
  }
  if (bVar4) {
    return iVar5;
  }
LAB_0011fbaf:
  *srcdat2 = local_40;
  *local_38 = local_41;
  return 0;
}

Assistant:

int RTPSources::GetRTCPSourceData(uint32_t ssrc,const RTPAddress *senderaddress,
		                  RTPInternalSourceData **srcdat2,bool *newsource)
{
	int status;
	bool created;
	RTPInternalSourceData *srcdat;
	
	*srcdat2 = 0;
	
	if ((status = ObtainSourceDataInstance(ssrc,&srcdat,&created)) < 0)
		return status;
	
	if (created)
	{
		if ((status = srcdat->SetRTCPDataAddress(senderaddress)) < 0)
			return status;
	}
	else // got a previously existing source
	{
		if (CheckCollision(srcdat,senderaddress,false))
			return 0; // ignore packet on collision
	}
	
	*srcdat2 = srcdat;
	*newsource = created;

	return 0;
}